

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O0

bool __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::SetPipelineState
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,IPipelineState *pPipelineState,
          INTERFACE_ID *IID_PSOImpl)

{
  ulong uVar1;
  bool bVar2;
  COMMAND_QUEUE_TYPE CVar3;
  int iVar4;
  Uint32 UVar5;
  Char *pCVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  PipelineStateVkImpl *pPVar7;
  PipelineStateVkImpl *pObj2;
  COMMAND_QUEUE_TYPE Type;
  char *in_R8;
  char (*in_R9) [8];
  char (*in_stack_fffffffffffffe58) [3];
  undefined1 local_148 [8];
  string msg_6;
  RefCntAutoPtr<Diligent::PipelineStateVkImpl> pPipelineStateImpl;
  string msg_5;
  string msg_4;
  String local_d8;
  undefined1 local_b8 [8];
  string msg_3;
  string msg_2;
  string msg_1;
  undefined1 local_48 [8];
  string msg;
  INTERFACE_ID *IID_PSOImpl_local;
  IPipelineState *pPipelineState_local;
  DeviceContextBase<Diligent::EngineVkImplTraits> *this_local;
  
  msg.field_2._8_8_ = IID_PSOImpl;
  if (pPipelineState == (IPipelineState *)0x0) {
    FormatString<char[32]>((string *)local_48,(char (*) [32])"Pipeline state must not be null");
    pCVar6 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar6,"SetPipelineState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x308);
    std::__cxx11::string::~string((string *)local_48);
    this_local._7_1_ = false;
  }
  else {
    if ((this->m_Desc).QueueType == COMMAND_QUEUE_TYPE_UNKNOWN) {
      bVar2 = IsDeferred(this);
      if (!bVar2) {
        FormatString<char[79]>
                  ((string *)((long)&msg_2.field_2 + 8),
                   (char (*) [79])
                   "Queue type may never be unknown for immediate contexts. This looks like a bug.")
        ;
        pCVar6 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar6,"SetPipelineState",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                   ,0x30c);
        std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
      }
      FormatString<char[97]>
                ((string *)((long)&msg_3.field_2 + 8),
                 (char (*) [97])
                 "Queue type is UNKNOWN. This indicates that Begin() has never been called for a deferred context."
                );
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"SetPipelineState",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x30c);
      std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
    }
    CVar3 = Diligent::operator&((this->m_Desc).QueueType,COMMAND_QUEUE_TYPE_COMPUTE);
    if (CVar3 != COMMAND_QUEUE_TYPE_COMPUTE) {
      GetCommandQueueTypeString_abi_cxx11_
                (&local_d8,(Diligent *)(ulong)(this->m_Desc).QueueType,Type);
      in_R8 = " queue.";
      FormatString<char[17],char[22],std::__cxx11::string,char[8]>
                ((string *)local_b8,(Diligent *)"SetPipelineState",(char (*) [17])0xcc2999,
                 (char (*) [22])&local_d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" queue.",
                 in_R9);
      std::__cxx11::string::~string((string *)&local_d8);
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"SetPipelineState",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x30c);
      std::__cxx11::string::~string((string *)local_b8);
    }
    iVar4 = (*(pPipelineState->super_IDeviceObject).super_IObject._vptr_IObject[4])();
    uVar1 = *(ulong *)(CONCAT44(extraout_var,iVar4) + 0x10);
    msg_4.field_2._M_local_buf[0xf] = (char)GetExecutionCtxId(this);
    UVar5 = IndexWrapper::operator_cast_to_unsigned_int
                      ((IndexWrapper *)(msg_4.field_2._M_local_buf + 0xf));
    if ((uVar1 & 1L << ((byte)UVar5 & 0x3f)) == 0) {
      iVar4 = (*(pPipelineState->super_IDeviceObject).super_IObject._vptr_IObject[4])();
      in_R8 = (char *)&this->m_Desc;
      FormatString<char[6],char_const*,char[36],char_const*,char[3]>
                ((string *)((long)&msg_5.field_2 + 8),(Diligent *)0xc0e54d,
                 (char (*) [6])CONCAT44(extraout_var_00,iVar4),
                 (char **)"\' can\'t be used in device context \'",(char (*) [36])in_R8,
                 (char **)"\'.",in_stack_fffffffffffffe58);
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"SetPipelineState",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x30f);
      std::__cxx11::string::~string((string *)(msg_5.field_2._M_local_buf + 8));
    }
    iVar4 = (*(pPipelineState->super_IDeviceObject).super_IObject._vptr_IObject[0x15])
                      (pPipelineState,0);
    if (iVar4 != 2) {
      iVar4 = (*(pPipelineState->super_IDeviceObject).super_IObject._vptr_IObject[4])();
      FormatString<char[6],char_const*,char[62]>
                ((string *)&pPipelineStateImpl,(Diligent *)0xc0e54d,
                 (char (*) [6])CONCAT44(extraout_var_01,iVar4),
                 (char **)"\' is not ready. Use GetStatus() to check the pipeline status.",
                 (char (*) [62])in_R8);
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"SetPipelineState",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x313);
      std::__cxx11::string::~string((string *)&pPipelineStateImpl);
    }
    RefCntAutoPtr<Diligent::PipelineStateVkImpl>::RefCntAutoPtr
              ((RefCntAutoPtr<Diligent::PipelineStateVkImpl> *)((long)&msg_6.field_2 + 8),
               (IObject *)pPipelineState,(INTERFACE_ID *)msg.field_2._8_8_);
    pPVar7 = Diligent::RefCntAutoPtr::operator_cast_to_PipelineStateVkImpl_
                       ((RefCntAutoPtr *)(msg_6.field_2._M_local_buf + 8));
    if (pPVar7 == (PipelineStateVkImpl *)0x0) {
      FormatString<char[45]>
                ((string *)local_148,(char (*) [45])"Unknown pipeline state object implementation");
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"SetPipelineState",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x318);
      std::__cxx11::string::~string((string *)local_148);
    }
    pPVar7 = Diligent::RefCntAutoPtr::operator_cast_to_PipelineStateVkImpl_
                       ((RefCntAutoPtr *)&this->m_pPipelineState);
    pObj2 = Diligent::RefCntAutoPtr::operator_cast_to_PipelineStateVkImpl_
                      ((RefCntAutoPtr *)(msg_6.field_2._M_local_buf + 8));
    bVar2 = DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
            ::IsSameObject((DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                            *)pPVar7,
                           (DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                            *)pObj2);
    if (!bVar2) {
      RefCntAutoPtr<Diligent::PipelineStateVkImpl>::operator=
                (&this->m_pPipelineState,
                 (RefCntAutoPtr<Diligent::PipelineStateVkImpl> *)((long)&msg_6.field_2 + 8));
      (this->m_Stats).CommandCounters.SetPipelineState =
           (this->m_Stats).CommandCounters.SetPipelineState + 1;
    }
    this_local._7_1_ = !bVar2;
    RefCntAutoPtr<Diligent::PipelineStateVkImpl>::~RefCntAutoPtr
              ((RefCntAutoPtr<Diligent::PipelineStateVkImpl> *)((long)&msg_6.field_2 + 8));
  }
  return this_local._7_1_;
}

Assistant:

inline bool DeviceContextBase<ImplementationTraits>::SetPipelineState(
    IPipelineState*     pPipelineState,
    const INTERFACE_ID& IID_PSOImpl)
{
    if (pPipelineState == nullptr)
    {
        DEV_ERROR("Pipeline state must not be null");
        return false;
    }

    DVP_CHECK_QUEUE_TYPE_COMPATIBILITY(COMMAND_QUEUE_TYPE_COMPUTE, "SetPipelineState");

    DEV_CHECK_ERR((pPipelineState->GetDesc().ImmediateContextMask & (Uint64{1} << GetExecutionCtxId())) != 0,
                  "PSO '", pPipelineState->GetDesc().Name, "' can't be used in device context '", m_Desc.Name, "'.");

    // Check that the PSO is ready before querying the implementation.
    DEV_CHECK_ERR(pPipelineState->GetStatus() == PIPELINE_STATE_STATUS_READY, "PSO '", pPipelineState->GetDesc().Name,
                  "' is not ready. Use GetStatus() to check the pipeline status.");

    // Note that pPipelineStateImpl may not be the same as pPipelineState (for example, if pPipelineState
    // is a reloadable pipeline).
    RefCntAutoPtr<PipelineStateImplType> pPipelineStateImpl{pPipelineState, IID_PSOImpl};
    VERIFY(pPipelineStateImpl != nullptr, "Unknown pipeline state object implementation");
    if (PipelineStateImplType::IsSameObject(m_pPipelineState, pPipelineStateImpl))
        return false;

    m_pPipelineState = std::move(pPipelineStateImpl);
    ++m_Stats.CommandCounters.SetPipelineState;

    return true;
}